

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_GE_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_GE_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, GE)
{
    if( int x = 1 )
        ASSERT_GE(1, x) << x;
    if( int x = 1 )
        EXPECT_GE(1, x) << x;
    if( int x = 1 )
        INFORM_GE(1, x) << x;
    if( int x = 1 )
        ASSUME_GE(1, x) << x;
}